

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

int __thiscall gvr::Mesh::getUsedVertices(Mesh *this,vector<bool,_std::allocator<bool>_> *vused)

{
  ulong *puVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  
  uVar5 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize(vused,(long)(this->super_PointCloud).n,false);
  uVar2 = (this->super_PointCloud).n;
  if (0 < (int)uVar2) {
    lVar3 = *(long *)vused;
    do {
      bVar4 = (byte)uVar5 & 0x3f;
      puVar1 = (ulong *)(lVar3 + (ulong)(uVar5 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  iVar8 = this->n;
  if (0 < iVar8) {
    lVar3 = *(long *)vused;
    iVar6 = iVar8 * 3 + 1;
    puVar7 = this->triangle + (iVar8 * 3 - 1);
    do {
      puVar1 = (ulong *)(lVar3 + (ulong)(*puVar7 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)*puVar7 & 0x3f);
      iVar6 = iVar6 + -1;
      puVar7 = puVar7 + -1;
    } while (1 < iVar6);
  }
  if ((int)uVar2 < 1) {
    iVar8 = 0;
  }
  else {
    auVar9._4_4_ = uVar2 - 1;
    auVar9._0_4_ = uVar2 - 1;
    auVar9._8_8_ = 0;
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_00127a00;
    auVar13 = ZEXT816(0x100000000);
    auVar11 = (undefined1  [16])0x0;
    do {
      auVar14 = auVar11;
      auVar11 = auVar13 ^ _DAT_00127a00;
      auVar12._0_4_ = -(uint)(auVar9._0_4_ < auVar11._0_4_);
      auVar12._4_4_ = -(uint)(auVar9._4_4_ < auVar11._4_4_);
      auVar12._8_4_ = -(uint)(auVar9._8_4_ < auVar11._8_4_);
      auVar12._12_4_ = -(uint)(auVar9._12_4_ < auVar11._12_4_);
      auVar15 = auVar14;
      if ((~auVar12._0_4_ & 1) != 0) {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(*(long *)vused + (ulong)(uVar5 >> 6) * 8);
      }
      if ((((ushort)auVar12._4_4_ ^ 0xffff) & 1) != 0) {
        auVar15._8_8_ = *(undefined8 *)(*(long *)vused + (ulong)(uVar5 >> 6) * 8);
      }
      uVar16 = 1L << (ulong)SUB164(auVar13 & _DAT_00127a10,0) & auVar15._0_8_;
      uVar18 = 1L << (SUB168(auVar13 & _DAT_00127a10,8) >> 0x20) & auVar15._8_8_;
      uVar17 = -(uint)((int)uVar18 == 0);
      uVar19 = -(uint)((int)(uVar18 >> 0x20) == 0);
      auVar11._0_4_ = (auVar14._0_4_ - (uint)((int)uVar16 == 0 && (int)(uVar16 >> 0x20) == 0)) + 1;
      auVar11._4_4_ = (uVar17 & uVar19) + auVar14._4_4_ + 1;
      auVar11._8_4_ = (uVar17 & uVar19) + auVar14._8_4_ + 1;
      auVar11._12_4_ = (uVar19 & uVar17) + auVar14._12_4_ + 1;
      uVar5 = uVar5 + 2;
      auVar10._0_4_ = auVar13._0_4_ + 2;
      auVar10._4_4_ = auVar13._4_4_ + 2;
      auVar10._8_4_ = auVar13._8_4_;
      auVar10._12_4_ = auVar13._12_4_;
      auVar13 = auVar10;
    } while ((uVar2 + 1 & 0xfffffffe) != uVar5);
    auVar13 = ~auVar12 & auVar11 | auVar14 & auVar12;
    iVar8 = auVar13._4_4_ + auVar13._0_4_;
  }
  return iVar8;
}

Assistant:

int Mesh::getUsedVertices(std::vector<bool> &vused)
{
  vused.resize(getVertexCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=3*getTriangleCount()-1; i>=0; i--)
  {
    vused[triangle[i]]=true;
  }

  int count=0;

  for (int i=0; i<getVertexCount(); i++)
    if (vused[i])
    {
      count++;
    }

  return count;
}